

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int i)

{
  undefined1 auVar1 [16];
  FILE *pFVar2;
  ulong uVar3;
  uint in_EDX;
  unsigned_long *in_RSI;
  vector<boomphf::level,_std::allocator<boomphf::level>_> *in_RDI;
  int ii_4;
  int ii_3;
  int ii_2;
  int ii_1;
  int ii;
  file_binary<unsigned_long> data_iterator_level;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  t_arg;
  pthread_t *tab_threads;
  char fname_prev [1000];
  char fname_curr [1000];
  char fname_old [1000];
  bitVector *in_stack_fffffffffffff1e8;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffff1f0;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffff1f8;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__r;
  pointer *in_stack_fffffffffffff208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff210;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffff218;
  bfile_iterator<unsigned_long> *__args;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  char *in_stack_fffffffffffff258;
  file_binary<unsigned_long> *in_stack_fffffffffffff260;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_d78;
  int local_d68;
  int local_d64;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_ce0;
  unsigned_long *local_cb8;
  unsigned_long *local_c90;
  bfile_iterator<unsigned_long> local_c78;
  uint local_c38;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_c30;
  char local_c28 [1008];
  char local_838 [1008];
  char local_448 [1076];
  uint local_14;
  unsigned_long *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[](in_RDI,(long)(int)in_EDX)
  ;
  bitVector::bitVector((bitVector *)in_stack_fffffffffffff1f0,(uint64_t)in_stack_fffffffffffff1e8);
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
            (in_RDI,(long)(int)local_14);
  bitVector::operator=((bitVector *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  bitVector::~bitVector((bitVector *)in_stack_fffffffffffff1f0);
  sprintf(local_448,"temp_p%i_level_%i",
          (ulong)*(uint *)&in_RDI[0x19].
                           super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(ulong)(local_14 - 2));
  sprintf(local_838,"temp_p%i_level_%i",
          (ulong)*(uint *)&in_RDI[0x19].
                           super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(ulong)local_14);
  sprintf(local_c28,"temp_p%i_level_%i",
          (ulong)*(uint *)&in_RDI[0x19].
                           super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(ulong)(local_14 - 1));
  if (((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
    if (2 < (int)local_14) {
      unlink(local_448);
    }
    if (((int)local_14 <
         *(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                  _M_impl.super__Vector_impl_data._M_start + -1) && (0 < (int)local_14)) {
      pFVar2 = fopen(local_838,"w");
      in_RDI[0x19].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pFVar2;
    }
  }
  in_RDI[0x15].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[0x14].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[0x15].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[0x14].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)((long)&in_RDI[0x14].
                                       super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_c30 = (thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)operator_new__(uVar3);
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::thread_args(in_stack_fffffffffffff1f0);
  local_c78._buffer = local_10;
  local_c90 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff1e8);
  std::
  make_shared<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffff218);
  __args = &local_c78;
  std::
  static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffff1f8);
  std::shared_ptr<void>::operator=
            ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
             (shared_ptr<void> *)in_stack_fffffffffffff1e8);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x1141df);
  std::
  shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)0x1141e9);
  local_cb8 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff1e8);
  std::
  make_shared<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)__args);
  std::
  static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffff1f8);
  std::shared_ptr<void>::operator=
            ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
             (shared_ptr<void> *)in_stack_fffffffffffff1e8);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x114250);
  std::
  shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)0x11425d);
  local_c38 = local_14;
  if ((((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) == 0) ||
     ((int)local_14 < 2)) {
    if ((((ulong)in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) ||
       ((int)local_14 <
        *(int *)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      for (local_dc0 = 0;
          local_dc0 <
          *(int *)((long)&in_RDI[0x14].
                          super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                          _M_impl.super__Vector_impl_data._M_start + 4); local_dc0 = local_dc0 + 1)
      {
        pthread_create((pthread_t *)(&local_c30->boophf + local_dc0),(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&local_c78._pos);
      }
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff1e8)
      ;
      std::
      make_shared<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)__args);
      __r = &local_d78;
      std::
      static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (__r);
      std::shared_ptr<void>::operator=
                ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
                 (shared_ptr<void> *)in_stack_fffffffffffff1e8);
      std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x114596);
      std::
      shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)0x1145a0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff1e8)
      ;
      std::
      make_shared<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)__args);
      std::
      static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (__r);
      std::shared_ptr<void>::operator=
                ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
                 (shared_ptr<void> *)in_stack_fffffffffffff1e8);
      std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x1145f6);
      std::
      shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)0x114600);
      for (local_dbc = 0;
          local_dbc <
          *(int *)((long)&in_RDI[0x14].
                          super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                          _M_impl.super__Vector_impl_data._M_start + 4); local_dbc = local_dbc + 1)
      {
        pthread_create((pthread_t *)(&local_c30->boophf + local_dbc),(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&local_c78._pos);
      }
    }
    for (local_dc4 = 0;
        local_dc4 <
        *(int *)((long)&in_RDI[0x14].
                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                        super__Vector_impl_data._M_start + 4); local_dc4 = local_dc4 + 1) {
      pthread_join((pthread_t)(&local_c30->boophf)[local_dc4],(void **)0x0);
    }
  }
  else {
    file_binary<unsigned_long>::file_binary(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
    file_binary<unsigned_long>::begin((file_binary<unsigned_long> *)in_stack_fffffffffffff1e8);
    std::make_shared<boomphf::bfile_iterator<unsigned_long>,boomphf::bfile_iterator<unsigned_long>>
              (__args);
    in_stack_fffffffffffff208 =
         &local_ce0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    in_stack_fffffffffffff210 = &local_ce0;
    std::static_pointer_cast<void,boomphf::bfile_iterator<unsigned_long>>
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)in_stack_fffffffffffff1f8);
    std::shared_ptr<void>::operator=
              ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
               (shared_ptr<void> *)in_stack_fffffffffffff1e8);
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x11430b);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x114315);
    bfile_iterator<unsigned_long>::~bfile_iterator
              ((bfile_iterator<unsigned_long> *)in_stack_fffffffffffff1f0);
    file_binary<unsigned_long>::end((file_binary<unsigned_long> *)in_stack_fffffffffffff1e8);
    std::make_shared<boomphf::bfile_iterator<unsigned_long>,boomphf::bfile_iterator<unsigned_long>>
              (__args);
    std::static_pointer_cast<void,boomphf::bfile_iterator<unsigned_long>>
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)in_stack_fffffffffffff1f8);
    std::shared_ptr<void>::operator=
              ((shared_ptr<void> *)in_stack_fffffffffffff1f0,
               (shared_ptr<void> *)in_stack_fffffffffffff1e8);
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x11438b);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x114398);
    bfile_iterator<unsigned_long>::~bfile_iterator
              ((bfile_iterator<unsigned_long> *)in_stack_fffffffffffff1f0);
    for (local_d64 = 0;
        local_d64 <
        *(int *)((long)&in_RDI[0x14].
                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                        super__Vector_impl_data._M_start + 4); local_d64 = local_d64 + 1) {
      pthread_create((pthread_t *)(&local_c30->boophf + local_d64),(pthread_attr_t *)0x0,
                     thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,boomphf::bfile_iterator<unsigned_long>>
                     ,&local_c78._pos);
    }
    for (local_d68 = 0;
        local_d68 <
        *(int *)((long)&in_RDI[0x14].
                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                        super__Vector_impl_data._M_start + 4); local_d68 = local_d68 + 1) {
      pthread_join((pthread_t)(&local_c30->boophf)[local_d68],(void **)0x0);
    }
    file_binary<unsigned_long>::~file_binary((file_binary<unsigned_long> *)0x1144e5);
  }
  if ((((ulong)in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_finish & 0x100000000) != 0) &&
     (local_14 ==
      *(uint *)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_fffffffffffff210,(size_type)in_stack_fffffffffffff208);
  }
  this_00 = local_c30;
  if (local_c30 !=
      (thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       *)0x0) {
    operator_delete__(local_c30);
  }
  if (((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
    if (((int)local_14 <
         *(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                  _M_impl.super__Vector_impl_data._M_start + -1) && (0 < (int)local_14)) {
      fflush((FILE *)in_RDI[0x19].
                     super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                     super__Vector_impl_data._M_start);
      fclose((FILE *)in_RDI[0x19].
                     super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                     super__Vector_impl_data._M_start);
    }
    if (local_14 ==
        *(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_start - 1U) {
      unlink(local_c28);
    }
  }
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~thread_args(this_00);
  return;
}

Assistant:

void processLevel(Range const& input_range,int i)
		{
			////alloc the bitset for this level
			_levels[i].bitset =  bitVector(_levels[i].hash_domain); ;

			//printf("---process level %i   wr %i fast %i ---\n",i,_writeEachLevel,_fastmode);
			
			char fname_old[1000];
			sprintf(fname_old,"temp_p%i_level_%i",_pid,i-2);
			
			char fname_curr[1000];
			sprintf(fname_curr,"temp_p%i_level_%i",_pid,i);
			
			char fname_prev[1000];
			sprintf(fname_prev,"temp_p%i_level_%i",_pid,i-1);
			
			if(_writeEachLevel)
			{
				//file management :
				
				if(i>2) //delete previous file
				{
					unlink(fname_old);
				}
				
				if(i< _nb_levels-1 && i > 0 ) //create curr file
				{
					_currlevelFile = fopen(fname_curr,"w");
				}
			}
			
			
			_cptLevel = 0;
			_hashidx = 0;
			_idxLevelsetLevelFastmode =0;
			_nb_living =0;
			//create  threads
			pthread_t *tab_threads= new pthread_t [_num_thread];
			typedef decltype(input_range.begin()) it_type;
			thread_args<Range, it_type> t_arg; // meme arg pour tous
			t_arg.boophf = this;
			t_arg.range = &input_range;
			t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.begin()));
			t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.end()));


			t_arg.level = i;
			
			
			if(_writeEachLevel && (i > 1))
			{

				auto data_iterator_level = file_binary<elem_t>(fname_prev);
				
				typedef decltype(data_iterator_level.begin()) disklevel_it_type;
				
				//data_iterator_level.begin();
				t_arg.it_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.begin()));
				t_arg.until_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.end()));
				
				for(int ii=0;ii<_num_thread;ii++)
					pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, disklevel_it_type>, &t_arg); //&t_arg[ii]
			
			
				//must join here before the block is closed and file_binary is destroyed (and closes the file)
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
				
			}
			
			else
			{
				if(_fastmode && i >= (_fastModeLevel+1))
				{

					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					typedef decltype(setLevelFastmode.begin()) fastmode_it_type;
					t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.begin()));
					t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.end()));
					
					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, fastmode_it_type>, &t_arg); //&t_arg[ii]
					
					
				}
				else
				{
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, decltype(input_range.begin())>, &t_arg); //&t_arg[ii]
				}
				//joining
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
			}
			//printf("\ngoing to level %i  : %llu elems  %.2f %%  expected : %.2f %% \n",i,_cptLevel,100.0* _cptLevel/(float)_nelem,100.0* pow(_proba_collision,i) );

			//printf("\ncpt total processed %llu \n",_cptTotalProcessed);
			if(_fastmode && i == _fastModeLevel) //shrink to actual number of elements in set
			{
				//printf("\nresize setLevelFastmode to %lli \n",_idxLevelsetLevelFastmode);
				setLevelFastmode.resize(_idxLevelsetLevelFastmode);
			}
			delete [] tab_threads;
			
			if(_writeEachLevel)
			{
				if(i< _nb_levels-1 && i>0)
				{
					fflush(_currlevelFile);
					fclose(_currlevelFile);
				}
				
					if(i== _nb_levels- 1) //delete last file
					{
						unlink(fname_prev);
					}
			}

		}